

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  size_t sVar2;
  bool bVar3;
  int i_1;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  int q;
  int _c;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint _w;
  uint uVar15;
  uint uVar16;
  float fVar17;
  int local_d8;
  Mat sums;
  Mat local_78;
  
  sVar2 = a->elemsize;
  iVar14 = a->dims;
  if (iVar14 == 3) {
    uVar6 = a->w;
    lVar12 = (long)(int)uVar6;
    uVar16 = a->h;
    _w = a->c;
    uVar8 = (ulong)_w;
    uVar15 = uVar16 * uVar6;
    bVar3 = !reduce_h;
    if ((!reduce_w || bVar3) || !reduce_c) {
      if ((reduce_w && !bVar3) && !reduce_c) {
        Mat::create(b,_w,sVar2,opt->blob_allocator);
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        if ((int)_w < 1) {
          uVar8 = 0;
        }
        for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
          Mat::channel(&sums,a,(int)uVar7);
          pvVar4 = sums.data;
          Mat::~Mat(&sums);
          fVar17 = 0.0;
          for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
            fVar1 = *(float *)((long)pvVar4 + uVar10 * 4);
            fVar17 = fVar17 + fVar1 * fVar1;
          }
          *(float *)((long)b->data + uVar7 * 4) = fVar17;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && !reduce_c) {
        Mat::create(b,uVar16,_w,sVar2,opt->blob_allocator);
        uVar7 = 0;
        if (0 < (int)uVar6) {
          uVar7 = (ulong)uVar6;
        }
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        if ((int)_w < 1) {
          uVar8 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
          Mat::channel(&sums,a,(int)uVar10);
          pvVar11 = sums.data;
          Mat::~Mat(&sums);
          iVar14 = b->w;
          sVar2 = b->elemsize;
          pvVar4 = b->data;
          for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
            fVar17 = 0.0;
            for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
              fVar1 = *(float *)((long)pvVar11 + uVar9 * 4);
              fVar17 = fVar17 + fVar1 * fVar1;
            }
            *(float *)((long)pvVar4 + uVar13 * 4 + (long)iVar14 * uVar10 * sVar2) = fVar17;
            pvVar11 = (void *)((long)pvVar11 + lVar12 * 4);
          }
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && reduce_c) {
        Mat::create(b,uVar16,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,1,uVar16,_w,sVar2,opt->workspace_allocator);
        iVar14 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar7 = 0;
          uVar10 = 0;
          if (0 < (int)uVar6) {
            uVar10 = (ulong)uVar6;
          }
          uVar13 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar13 = uVar7;
          }
          if ((int)_w < 1) {
            uVar8 = uVar7;
          }
          while( true ) {
            local_d8 = (int)uVar8;
            iVar14 = (int)uVar7;
            if (iVar14 == local_d8) break;
            Mat::channel(&local_78,a,iVar14);
            pvVar4 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&sums,iVar14);
            pvVar11 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar7 = 0; uVar7 != uVar13; uVar7 = uVar7 + 1) {
              fVar17 = 0.0;
              for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
                fVar1 = *(float *)((long)pvVar4 + uVar9 * 4);
                fVar17 = fVar17 + fVar1 * fVar1;
              }
              *(float *)((long)pvVar11 + uVar7 * 4) = fVar17;
              pvVar4 = (void *)((long)pvVar4 + lVar12 * 4);
            }
            uVar7 = (ulong)(iVar14 + 1);
          }
          Mat::fill(b,0.0);
          for (_c = 0; iVar14 = 0, _c != local_d8; _c = _c + 1) {
            Mat::channel(&local_78,&sums,_c);
            pvVar11 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar4 = b->data;
            for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
              *(float *)((long)pvVar4 + uVar8 * 4) =
                   *(float *)((long)pvVar11 + uVar8 * 4) + *(float *)((long)pvVar4 + uVar8 * 4);
            }
          }
        }
      }
      else {
        if ((bVar3 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar6,uVar16,sVar2,opt->blob_allocator);
            Mat::fill(b,0.0);
            if ((int)uVar15 < 1) {
              uVar15 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar6 = 0; uVar6 != _w; uVar6 = uVar6 + 1) {
              Mat::channel(&sums,a,uVar6);
              pvVar11 = sums.data;
              Mat::~Mat(&sums);
              pvVar4 = b->data;
              for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
                fVar17 = *(float *)((long)pvVar11 + uVar8 * 4);
                *(float *)((long)pvVar4 + uVar8 * 4) =
                     fVar17 * fVar17 + *(float *)((long)pvVar4 + uVar8 * 4);
              }
            }
            return 0;
          }
          if ((!bVar3 && !reduce_w) && !reduce_c) {
            Mat::create(b,uVar6,_w,sVar2,opt->blob_allocator);
            Mat::fill(b,0.0);
            uVar7 = 0;
            if (0 < (int)uVar6) {
              uVar7 = (ulong)uVar6;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            if ((int)_w < 1) {
              uVar8 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
              Mat::channel(&sums,a,(int)uVar10);
              pvVar11 = sums.data;
              Mat::~Mat(&sums);
              lVar5 = b->elemsize * uVar10 * (long)b->w;
              pvVar4 = b->data;
              for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
                for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
                  fVar17 = *(float *)((long)pvVar11 + uVar13 * 4);
                  *(float *)((long)pvVar4 + uVar13 * 4 + lVar5) =
                       fVar17 * fVar17 + *(float *)((long)pvVar4 + uVar13 * 4 + lVar5);
                }
                pvVar11 = (void *)((long)pvVar11 + lVar12 * 4);
              }
            }
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar6,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,uVar6,1,_w,sVar2,opt->workspace_allocator);
        iVar14 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar15 = 0;
          uVar8 = 0;
          if (0 < (int)uVar6) {
            uVar8 = (ulong)uVar6;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (; uVar15 != _w; uVar15 = uVar15 + 1) {
            Mat::channel(&local_78,a,uVar15);
            pvVar4 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&sums,uVar15);
            pvVar11 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
              for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
                fVar17 = *(float *)((long)pvVar4 + uVar7 * 4);
                *(float *)((long)pvVar11 + uVar7 * 4) =
                     fVar17 * fVar17 + *(float *)((long)pvVar11 + uVar7 * 4);
              }
              pvVar4 = (void *)((long)pvVar4 + lVar12 * 4);
            }
          }
          Mat::fill(b,0.0);
          iVar14 = 0;
          for (uVar6 = 0; uVar6 != _w; uVar6 = uVar6 + 1) {
            Mat::channel(&local_78,&sums,uVar6);
            pvVar11 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar4 = b->data;
            for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
              *(float *)((long)pvVar4 + uVar7 * 4) =
                   *(float *)((long)pvVar11 + uVar7 * 4) + *(float *)((long)pvVar4 + uVar7 * 4);
            }
          }
        }
      }
      goto LAB_001e6472;
    }
    Mat::create(b,1,sVar2,opt->blob_allocator);
    Mat::Mat(&sums,_w,sVar2,opt->workspace_allocator);
    iVar14 = -100;
    if ((sums.data == (void *)0x0) || ((long)sums.c * sums.cstep == 0)) goto LAB_001e6472;
    uVar10 = 0;
    uVar7 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar7 = uVar10;
    }
    if ((int)_w < 1) {
      uVar8 = uVar10;
    }
    for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
      Mat::channel(&local_78,a,(int)uVar10);
      pvVar4 = local_78.data;
      Mat::~Mat(&local_78);
      fVar17 = 0.0;
      for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
        fVar1 = *(float *)((long)pvVar4 + uVar13 * 4);
        fVar17 = fVar17 + fVar1 * fVar1;
      }
      *(float *)((long)sums.data + uVar10 * 4) = fVar17;
    }
    fVar17 = 0.0;
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      fVar17 = fVar17 + *(float *)((long)sums.data + uVar7 * 4);
    }
  }
  else {
    if (iVar14 != 2) {
      if (iVar14 == 1) {
        uVar6 = a->w;
        Mat::create(b,1,sVar2,opt->blob_allocator);
        uVar7 = 0;
        uVar8 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar8 = uVar7;
        }
        fVar17 = 0.0;
        for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)a->data + uVar7 * 4);
          fVar17 = fVar17 + fVar1 * fVar1;
        }
        *(float *)b->data = fVar17;
        return 0;
      }
      return 0;
    }
    uVar6 = a->w;
    uVar16 = a->h;
    if (!reduce_w || !reduce_h) {
      if (reduce_w && !reduce_h) {
        Mat::create(b,uVar16,sVar2,opt->blob_allocator);
        pvVar4 = a->data;
        iVar14 = a->w;
        sVar2 = a->elemsize;
        pvVar11 = b->data;
        uVar8 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar8 = 0;
        }
        uVar7 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar7 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
          fVar17 = 0.0;
          for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
            fVar1 = *(float *)((long)pvVar4 + uVar13 * 4);
            fVar17 = fVar17 + fVar1 * fVar1;
          }
          *(float *)((long)pvVar11 + uVar10 * 4) = fVar17;
          pvVar4 = (void *)((long)pvVar4 + (long)iVar14 * sVar2);
        }
        return 0;
      }
      if (reduce_h && !reduce_w) {
        Mat::create(b,uVar6,sVar2,opt->blob_allocator);
        Mat::fill(b,0.0);
        pvVar4 = a->data;
        iVar14 = a->w;
        sVar2 = a->elemsize;
        uVar8 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar8 = 0;
        }
        uVar7 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar7 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
          pvVar11 = b->data;
          for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
            fVar17 = *(float *)((long)pvVar4 + uVar13 * 4);
            *(float *)((long)pvVar11 + uVar13 * 4) =
                 fVar17 * fVar17 + *(float *)((long)pvVar11 + uVar13 * 4);
          }
          pvVar4 = (void *)((long)pvVar4 + (long)iVar14 * sVar2);
        }
        return 0;
      }
      return 0;
    }
    Mat::create(b,1,sVar2,opt->blob_allocator);
    Mat::Mat(&sums,uVar16,sVar2,opt->workspace_allocator);
    iVar14 = -100;
    if ((sums.data == (void *)0x0) || ((long)sums.c * sums.cstep == 0)) goto LAB_001e6472;
    iVar14 = a->w;
    sVar2 = a->elemsize;
    uVar7 = 0;
    uVar8 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar8 = uVar7;
    }
    pvVar4 = a->data;
    uVar10 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar10 = uVar7;
    }
    for (; fVar17 = 0.0, uVar7 != uVar10; uVar7 = uVar7 + 1) {
      for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
        fVar1 = *(float *)((long)pvVar4 + uVar13 * 4);
        fVar17 = fVar17 + fVar1 * fVar1;
      }
      *(float *)((long)sums.data + uVar7 * 4) = fVar17;
      pvVar4 = (void *)((long)pvVar4 + (long)iVar14 * sVar2);
    }
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      fVar17 = fVar17 + *(float *)((long)sums.data + uVar8 * 4);
    }
  }
  *(float *)b->data = fVar17;
  iVar14 = 0;
LAB_001e6472:
  Mat::~Mat(&sums);
  return iVar14;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);

            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}